

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  char **szCurrent_00;
  bool bVar1;
  reference pvVar2;
  Face local_f0;
  uint local_28;
  uint local_24;
  int iTime;
  uint iCurIndex;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  local_24 = 0;
  _iTime = szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  while ((bVar1 = SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local)
         , bVar1 && (bVar1 = TokenMatch<char_const>((char **)&szCurrentOut_local,"end",3), !bVar1)))
  {
    bVar1 = TokenMatch<char_const>((char **)&szCurrentOut_local,"time",4);
    if (bVar1) {
      local_28 = 0;
      bVar1 = ParseSignedInt(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                             (int *)&local_28);
      if ((!bVar1) || (this->configFrameID != local_28)) break;
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    }
    else {
      if (local_24 == 0) {
        SMD::Face::Face(&local_f0);
        std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::push_back
                  (&this->asTriangles,&local_f0);
        SMD::Face::~Face(&local_f0);
      }
      szCurrent_00 = szCurrentOut_local;
      local_24 = local_24 + 1;
      if (local_24 == 3) {
        local_24 = 0;
      }
      pvVar2 = std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::back
                         (&this->asTriangles);
      ParseVertex(this,(char *)szCurrent_00,(char **)&szCurrentOut_local,
                  pvVar2->avVertices + local_24,true);
    }
  }
  if ((local_24 != 2) &&
     (bVar1 = std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::empty
                        (&this->asTriangles), !bVar1)) {
    std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::pop_back(&this->asTriangles)
    ;
  }
  SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
  *_iTime = (char *)szCurrentOut_local;
  return;
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}